

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O1

FT_Int ft_mem_strcpyn(char *dst,char *src,FT_ULong size)

{
  char cVar1;
  
  if (1 < size) {
    do {
      cVar1 = *src;
      if (cVar1 == '\0') break;
      src = src + 1;
      *dst = cVar1;
      dst = dst + 1;
      size = size - 1;
    } while (1 < size);
  }
  *dst = '\0';
  return (FT_Int)(*src != '\0');
}

Assistant:

FT_BASE_DEF( FT_Int )
  ft_mem_strcpyn( char*        dst,
                  const char*  src,
                  FT_ULong     size )
  {
    while ( size > 1 && *src != 0 )
    {
      *dst++ = *src++;
      size--;
    }

    *dst = 0;  /* always zero-terminate */

    return *src != 0;
  }